

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_FSA_kry.c
# Opt level: O0

void PrintOutput(void *cvode_mem,sunrealtype t,N_Vector y)

{
  undefined4 uVar1;
  undefined8 *puVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  sunrealtype *ydata;
  sunrealtype hu;
  int retval;
  int qu;
  long nst;
  int opt;
  char *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffdc;
  undefined8 local_20 [2];
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_XMM0_Qa;
  local_8 = in_RDI;
  puVar2 = (undefined8 *)N_VGetArrayPointer(in_RSI);
  uVar1 = CVodeGetNumSteps(local_8,local_20);
  opt = (int)((ulong)puVar2 >> 0x20);
  check_retval((void *)CONCAT44(in_stack_ffffffffffffffdc,uVar1),in_stack_ffffffffffffffd0,opt);
  uVar1 = CVodeGetLastOrder(local_8,&stack0xffffffffffffffdc);
  check_retval((void *)CONCAT44(in_stack_ffffffffffffffdc,uVar1),in_stack_ffffffffffffffd0,opt);
  uVar1 = CVodeGetLastStep(local_8,&stack0xffffffffffffffd0);
  check_retval((void *)CONCAT44(in_stack_ffffffffffffffdc,uVar1),in_stack_ffffffffffffffd0,opt);
  printf("%8.3e %2d  %8.3e %5ld\n",local_10,in_stack_ffffffffffffffd0,
         (ulong)in_stack_ffffffffffffffdc,local_20[0]);
  printf("                                Solution       ");
  printf("%12.4e %12.4e \n",*puVar2,puVar2[0x1c0]);
  printf("                                               ");
  printf("%12.4e %12.4e \n",puVar2[1],puVar2[0x1c1]);
  return;
}

Assistant:

static void PrintOutput(void* cvode_mem, sunrealtype t, N_Vector y)
{
  long int nst;
  int qu, retval;
  sunrealtype hu;
  sunrealtype* ydata;

  ydata = N_VGetArrayPointer(y);

  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetLastOrder(cvode_mem, &qu);
  check_retval(&retval, "CVodeGetLastOrder", 1);
  retval = CVodeGetLastStep(cvode_mem, &hu);
  check_retval(&retval, "CVodeGetLastStep", 1);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%8.3Le %2d  %8.3Le %5ld\n", t, qu, hu, nst);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%8.3e %2d  %8.3e %5ld\n", t, qu, hu, nst);
#else
  printf("%8.3e %2d  %8.3e %5ld\n", t, qu, hu, nst);
#endif

  printf("                                Solution       ");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le %12.4Le \n", IJKth(ydata, 1, 0, 0),
         IJKth(ydata, 1, MX - 1, MZ - 1));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e %12.4e \n", IJKth(ydata, 1, 0, 0),
         IJKth(ydata, 1, MX - 1, MZ - 1));
#else
  printf("%12.4e %12.4e \n", IJKth(ydata, 1, 0, 0),
         IJKth(ydata, 1, MX - 1, MZ - 1));
#endif
  printf("                                               ");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le %12.4Le \n", IJKth(ydata, 2, 0, 0),
         IJKth(ydata, 2, MX - 1, MZ - 1));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e %12.4e \n", IJKth(ydata, 2, 0, 0),
         IJKth(ydata, 2, MX - 1, MZ - 1));
#else
  printf("%12.4e %12.4e \n", IJKth(ydata, 2, 0, 0),
         IJKth(ydata, 2, MX - 1, MZ - 1));
#endif
}